

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

void sg_init_buffer(sg_buffer buf_id,sg_buffer_desc *desc)

{
  _sg_buffer_t *buf;
  long lVar1;
  sg_buffer_desc *psVar2;
  sg_usage sVar3;
  sg_buffer_desc def;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3df6,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
  }
  psVar2 = &def;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)psVar2 = *(undefined8 *)desc;
    desc = (sg_buffer_desc *)&desc->size;
    psVar2 = (sg_buffer_desc *)((long)psVar2 + 8);
  }
  sVar3 = def.usage;
  def.type = def.type + (uint)(def.type == _SG_BUFFERTYPE_DEFAULT);
  def.usage = sVar3 + (sVar3 == _SG_USAGE_DEFAULT);
  if (def.size == 0) {
    def.size = def.data.size;
  }
  else if (def.data.size == 0) {
    def.data.size = def.size;
  }
  buf = _sg_lookup_buffer((_sg_pools_t *)(ulong)buf_id.id,(uint32_t)desc);
  if (buf != (_sg_buffer_t *)0x0) {
    if ((buf->slot).state != SG_RESOURCESTATE_ALLOC) {
      _sg_log("sg_init_buffer: buffer must be in alloc state\n");
      return;
    }
    _sg_init_buffer(buf,&def);
    if (((buf->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
      __assert_fail("(buf->slot.state == SG_RESOURCESTATE_VALID) || (buf->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3dfc,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
    }
  }
  return;
}

Assistant:

inline void sg_init_buffer(sg_buffer buf_id, const sg_buffer_desc& desc) { return sg_init_buffer(buf_id, &desc); }